

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

Expr * nivalis::anon_unknown_3::wrap_expr(uint32_t opcode,Expr *a)

{
  reference pvVar1;
  iterator __last;
  __normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  __first;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RDX;
  uint32_t in_ESI;
  Expr *in_RDI;
  Expr *new_expr;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_ffffffffffffff78
  ;
  difference_type in_stack_ffffffffffffff80;
  Expr *this;
  __normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
  in_stack_ffffffffffffff98;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_ffffffffffffffa0
  ;
  ASTNode local_40 [2];
  undefined1 local_19;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *local_18;
  uint32_t local_c;
  
  local_19 = 0;
  this = in_RDI;
  local_18 = in_RDX;
  local_c = in_ESI;
  Expr::Expr(in_RDI);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size(local_18);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
            (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98._M_current);
  Expr::ASTNode::ASTNode(local_40,local_c,0xffffffffffffffff);
  pvVar1 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator[]
                     (&this->ast,0);
  pvVar1->opcode = local_40[0].opcode;
  *(undefined4 *)&pvVar1->field_0x4 = local_40[0]._4_4_;
  pvVar1->field_1 = local_40[0].field_1;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::begin
            (in_stack_ffffffffffffff78);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::end
            (in_stack_ffffffffffffff78);
  __last = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::begin
                     (in_stack_ffffffffffffff78);
  __first = __gnu_cxx::
            __normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
            ::operator+((__normal_iterator<nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
                         *)in_RDI,in_stack_ffffffffffffff80);
  std::
  copy<__gnu_cxx::__normal_iterator<nivalis::Expr::ASTNode_const*,std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>,__gnu_cxx::__normal_iterator<nivalis::Expr::ASTNode*,std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>
            ((__normal_iterator<const_nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
              )__first._M_current,
             (__normal_iterator<const_nivalis::Expr::ASTNode_*,_std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>
              )__last._M_current,in_stack_ffffffffffffff98);
  return in_RDI;
}

Assistant:

Expr wrap_expr(uint32_t opcode, const Expr& a) {
    Expr new_expr;
    new_expr.ast.resize(a.ast.size() + 1);
    new_expr.ast[0] = opcode;
    std::copy(a.ast.begin(), a.ast.end(), new_expr.ast.begin() + 1);
    return new_expr;
}